

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

ChMatrix33<double> * __thiscall
chrono::fea::ChElementHexaANCF_3843::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementHexaANCF_3843 *this,double xi,
          double eta,double zeta)

{
  undefined8 uVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  element_type *peVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Index row;
  long lVar29;
  double *pdVar30;
  ActualDstType actualDst;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  double dVar40;
  undefined1 auVar41 [16];
  double dVar43;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNMc<double,_3,_3> Fdot;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  Scalar local_b08;
  Matrix<double,_3,_3,_0,_3,_3> local_b00;
  ulong auStack_ab0 [6];
  undefined1 local_a80 [16];
  double local_a70;
  double local_a68;
  double local_a60 [3];
  ulong auStack_a48 [3];
  MatrixNx3c *local_a30;
  Matrix<double,_3,_3,_1,_3,_3> *local_a28;
  double local_a20;
  Matrix<double,_3,_3,_0,_3,_3> local_780;
  Matrix<double,_3,_3,_1,_3,_3> local_700;
  Matrix3xN local_680;
  MatrixNx3c local_380;
  
  Calc_Sxi_D(this,&local_380,xi,eta,zeta);
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.array[0]
       = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            (&local_700,&this->m_ebar0,&local_380,(Scalar *)&local_680);
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_380;
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_700;
  local_a80._0_8_ = &local_380;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_a80 + 8),
        (SrcXprType *)
        (local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array + 1),(assign_op<double,_double> *)&local_680);
  local_a30 = (MatrixNx3c *)local_a80._0_8_;
  local_a20 = 1.48219693752374e-323;
  auVar2 = *(undefined1 (*) [64])
            (((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
            m_storage).m_data.array;
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
             m_storage).m_data.array + 8);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
             m_storage).m_data.array + 0x10);
  auVar5 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
             m_storage).m_data.array + 0x18);
  auVar6 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
             m_storage).m_data.array + 0x20);
  auVar7 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
             m_storage).m_data.array + 0x40);
  auVar8 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
             m_storage).m_data.array + 0x28);
  auVar9 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
             m_storage).m_data.array + 0x48);
  auVar10 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
              m_storage).m_data.array + 0x30);
  auVar11 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
              m_storage).m_data.array + 0x50);
  auVar12 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
              m_storage).m_data.array + 0x38);
  auVar13 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_a80._0_8_)->
              m_storage).m_data.array + 0x58);
  lVar29 = 7;
  pdVar30 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.
            m_data.array + 0x18;
  do {
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auStack_ab0[lVar29];
    auVar36 = vbroadcastsd_avx512f(auVar31);
    auVar37 = vmulpd_avx512f(auVar2,auVar36);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auStack_ab0[lVar29 + 3];
    auVar38 = vbroadcastsd_avx512f(auVar32);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *(ulong *)(local_a80 + lVar29 * 8);
    auVar39 = vbroadcastsd_avx512f(auVar33);
    auVar37 = vfmadd231pd_avx512f(auVar37,auVar6,auVar38);
    auVar37 = vfmadd231pd_avx512f(auVar37,auVar7,auVar39);
    *(undefined1 (*) [64])((plain_array<double,_96,_1,_64> *)(pdVar30 + -0x18))->array = auVar37;
    auVar37 = vmulpd_avx512f(auVar3,auVar36);
    auVar37 = vfmadd231pd_avx512f(auVar37,auVar8,auVar38);
    auVar37 = vfmadd231pd_avx512f(auVar37,auVar9,auVar39);
    *(undefined1 (*) [64])(pdVar30 + -0x10) = auVar37;
    auVar37 = vmulpd_avx512f(auVar4,auVar36);
    auVar37 = vfmadd231pd_avx512f(auVar37,auVar10,auVar38);
    auVar37 = vfmadd231pd_avx512f(auVar37,auVar11,auVar39);
    *(undefined1 (*) [64])(pdVar30 + -8) = auVar37;
    auVar36 = vmulpd_avx512f(auVar5,auVar36);
    auVar36 = vfmadd231pd_avx512f(auVar36,auVar12,auVar38);
    auVar36 = vfmadd231pd_avx512f(auVar36,auVar13,auVar39);
    *(undefined1 (*) [64])pdVar30 = auVar36;
    lVar29 = lVar29 + 1;
    pdVar30 = pdVar30 + 0x20;
  } while (lVar29 != 10);
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[0]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[0];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[1]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[1];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[2]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[2];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[3]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[3];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[4]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[4];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[5]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[5];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[6]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[6];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[7]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[7];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[8]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[8];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[9]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[9];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [10] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[10];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xb] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xb];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xc] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xc];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xd] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xd];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xe] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xe];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xf] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xf];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x10] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x10];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x11] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x11];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x12] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x12];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x13] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x13];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x14] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x14];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x15] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x15];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x16] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x16];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x17] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x17];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x18] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x18];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x19] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x19];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1f];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x20] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x20];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x21] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x21];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x22] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x22];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x23] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x23];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x24] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x24];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x25] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x25];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x26] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x26];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x27] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x27];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x28] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x28];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x29] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x29];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2f];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x30] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x30];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x31] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x31];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x32] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x32];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x33] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x33];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x34] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x34];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x35] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x35];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x36] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x36];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x37] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x37];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x38] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x38];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x39] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x39];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3f];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x40] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x40];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x41] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x41];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x42] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x42];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x43] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x43];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x44] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x44];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x45] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x45];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x46] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x46];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x47] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x47];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x48] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x48];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x49] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x49];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4f];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x50] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x50];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x51] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x51];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x52] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x52];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x53] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x53];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x54] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x54];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x55] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x55];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x56] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x56];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x57] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x57];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x58] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x58];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x59] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x59];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5f];
  local_a28 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_a80 + 8);
  CalcCoordMatrix(this,&local_680);
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_a80._0_8_ = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_b00,&local_680,&local_380,(Scalar *)local_a80);
  dVar22 = (local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] *
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] +
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] *
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] *
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] + -1.0) * 0.5;
  dVar23 = (local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] *
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] *
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] +
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] *
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] + -1.0) * 0.5;
  dVar24 = (local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] *
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] +
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] *
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] *
            local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] + -1.0) * 0.5;
  dVar40 = local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] *
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar43 = local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] *
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] +
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar21 = local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] *
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar21;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar43;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar40;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar24;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar23;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar22;
  if (this->m_damping_enabled == true) {
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_a80);
    local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = 0.0;
    local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = 0.0;
    local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    local_b08 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
              (&local_780,(Matrix3xN *)local_a80,&local_380,&local_b08);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = this->m_Alpha;
    auVar25._8_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar25._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar28._8_8_ =
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar28._0_8_ =
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar31 = vmulpd_avx512vl(auVar25,auVar28);
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar59._8_8_ = 0;
    auVar59._0_8_ =
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar32 = vmulsd_avx512f(auVar49,auVar59);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar22;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auVar31._0_8_ + auVar31._8_8_ + auVar32._0_8_;
    auVar31 = vfmadd213sd_fma(auVar48,auVar41,auVar14);
    auVar26._8_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar26._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar53._8_8_ = 0;
    auVar53._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar23;
    auVar52._8_8_ = 0;
    auVar52._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar32 = vfmadd213sd_fma(auVar52,auVar41,auVar15);
    auVar27._8_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar27._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar56._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar56._8_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar57._8_8_ = 0;
    auVar57._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar58._8_8_ = 0;
    auVar58._0_8_ =
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar33 = vmulsd_avx512f(auVar57,auVar58);
    auVar33 = vaddsd_avx512f(auVar56,auVar33);
    auVar45._0_8_ =
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar45._8_8_ =
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar34 = vmulsd_avx512f(auVar53,auVar58);
    auVar34 = vaddsd_avx512f(auVar45,auVar34);
    auVar31 = vunpcklpd_avx(auVar31,auVar32);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar24;
    auVar32 = vfmadd213sd_fma(auVar33,auVar41,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar40;
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] + auVar34._0_8_;
    auVar33 = vfmadd213sd_fma(auVar46,auVar41,auVar17);
    auVar32 = vunpcklpd_avx(auVar32,auVar33);
    auVar33 = vmulpd_avx512vl(auVar28,auVar27);
    auVar34 = vmulsd_avx512f(auVar59,auVar57);
    auVar35 = vmulpd_avx512vl(auVar28,auVar26);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar43;
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         auVar33._0_8_ + auVar33._8_8_ + auVar34._0_8_ +
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar33 = vfmadd213sd_fma(auVar47,auVar41,auVar18);
    auVar60._8_8_ = 0;
    auVar60._0_8_ =
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar34 = vmulsd_avx512f(auVar60,auVar53);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar21;
    auVar44._8_8_ = 0;
    auVar44._0_8_ =
         auVar35._0_8_ + auVar35._8_8_ + auVar34._0_8_ +
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_780.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_b00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar34 = vfmadd213sd_fma(auVar44,auVar41,auVar19);
    auVar33 = vunpcklpd_avx(auVar33,auVar34);
  }
  else {
    auVar31 = vunpcklpd_avx(auVar55,auVar54);
    auVar32 = vunpcklpd_avx(auVar51,auVar50);
    auVar33 = vunpcklpd_avx(auVar35,auVar34);
  }
  peVar20 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pdVar30 = (double *)
            ((long)(peVar20->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array + 0x20);
  lVar29 = 0;
  do {
    dVar40 = auVar31._0_8_ * ((plain_array<double,_36,_1,_32> *)(pdVar30 + -4))->array[0] +
             auVar32._0_8_ * pdVar30[-2] + auVar33._0_8_ * *pdVar30;
    dVar43 = auVar31._8_8_ * pdVar30[-3] + auVar32._8_8_ * pdVar30[-1] + auVar33._8_8_ * pdVar30[1];
    auVar42._0_8_ = dVar40 + dVar43;
    auVar42._8_8_ = dVar40 + dVar43;
    uVar1 = vmovlpd_avx(auVar42);
    *(undefined8 *)(local_a80 + lVar29 * 8) = uVar1;
    lVar29 = lVar29 + 1;
    pdVar30 = pdVar30 + 6;
  } while (lVar29 != 6);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_a80._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (double)local_a80._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = local_a70
  ;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = local_a68
  ;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = local_a68
  ;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_a60[0];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_a60[0];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_a60[1];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_a60[1];
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementHexaANCF_3843::GetPK2Stress(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}